

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

Profiler * __thiscall Js::ScriptContext::CreateProfiler(ScriptContext *this)

{
  Recycler *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContextProfiler *this_01;
  Profiler *pPVar4;
  
  if (this->profiler != (ScriptContextProfiler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0xc5f,"(profiler == nullptr)","profiler == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,ProfileFlag);
  if (bVar2) {
    this_01 = (ScriptContextProfiler *)
              Memory::NoCheckHeapAllocator::Alloc
                        ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,0x40);
    ScriptContextProfiler::ScriptContextProfiler(this_01);
    this->profiler = this_01;
    ScriptContextProfiler::Initialize
              (this_01,&(this->threadContext->pageAllocator).super_PageAllocator,
               this->threadContext->recycler);
    CreateProfilerNativeCodeGen(this->nativeCodeGen,this->profiler);
    this->isProfilerCreated = true;
    this_00 = this->threadContext->recycler;
    pPVar4 = this_00->profiler;
    Memory::Recycler::SetProfiler
              (this_00,this->profiler->profiler,this->profiler->backgroundRecyclerProfiler);
  }
  else {
    pPVar4 = (Profiler *)0x0;
  }
  return pPVar4;
}

Assistant:

Profiler *
        ScriptContext::CreateProfiler()
    {
            Assert(profiler == nullptr);
            if (Js::Configuration::Global.flags.IsEnabled(Js::ProfileFlag))
            {
                this->profiler = NoCheckHeapNew(ScriptContextProfiler);
                this->profiler->Initialize(GetThreadContext()->GetPageAllocator(), threadContext->GetRecycler());

#if ENABLE_NATIVE_CODEGEN
                CreateProfilerNativeCodeGen(this->nativeCodeGen, this->profiler);
#endif

                this->isProfilerCreated = true;
                Profiler * oldProfiler = this->threadContext->GetRecycler()->GetProfiler();
                this->threadContext->GetRecycler()->SetProfiler(this->profiler->GetProfiler(), this->profiler->GetBackgroundRecyclerProfiler());
                return oldProfiler;
            }
            return nullptr;
    }